

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O1

void __thiscall
DatabaseSnapshot::reindex_dataset
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          string *dataset_name)

{
  atomic_uint64_t *paVar1;
  Task *pTVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  pointer pcVar4;
  OnDiskDataset *pOVar5;
  string *obj_name;
  _Rb_tree_node_base *p_Var6;
  runtime_error *this_00;
  Indexer indexer;
  DbChangeType local_26c;
  Task *local_268;
  string local_260;
  OnDiskDataset *local_240;
  string local_238;
  pointer local_218;
  pointer local_210;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  DBChange local_1e0;
  DBChange local_198;
  DBChange local_150;
  Indexer local_108;
  
  local_268 = task;
  pOVar5 = find_dataset(this,dataset_name);
  if (pOVar5 == (OnDiskDataset *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"source dataset was not found");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Indexer::Indexer(&local_108,this,types);
  local_208._8_8_ = &local_268;
  LOCK();
  (local_268->spec_->work_estimated_).super___atomic_base<unsigned_long>._M_i =
       (pOVar5->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
       super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
       super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count + 1;
  UNLOCK();
  pcStack_1f0 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:176:31)>
                ::_M_invoke;
  local_1f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:176:31)>
              ::_M_manager;
  local_208._M_unused._M_object = &local_108;
  OnDiskFileIndex::for_each_filename
            ((OnDiskFileIndex *)&pOVar5->files_index,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_208);
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  local_240 = pOVar5;
  Indexer::finalize((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                    &local_238,&local_108);
  local_218 = (pointer)local_238._M_string_length;
  pcVar4 = local_210;
  if (local_238._M_dataplus._M_p != (pointer)local_238._M_string_length) {
    psVar3 = &local_240->taints;
    local_210 = local_238._M_dataplus._M_p;
    do {
      pTVar2 = local_268;
      pOVar5 = *(OnDiskDataset **)local_210;
      local_26c = Insert;
      obj_name = OnDiskDataset::get_name_abi_cxx11_(pOVar5);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
      DBChange::DBChange(&local_1e0,&local_26c,obj_name,&local_260);
      std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                (&pTVar2->changes_,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.parameter._M_dataplus._M_p != &local_1e0.parameter.field_2) {
        operator_delete(local_1e0.parameter._M_dataplus._M_p,
                        local_1e0.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.obj_name._M_dataplus._M_p != &local_1e0.obj_name.field_2) {
        operator_delete(local_1e0.obj_name._M_dataplus._M_p,
                        local_1e0.obj_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (local_240->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pTVar2 = local_268;
      pcVar4 = local_210;
      while (local_268 = pTVar2,
            (_Rb_tree_header *)p_Var6 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
        local_26c = ToggleTaint;
        local_210 = pcVar4;
        OnDiskDataset::get_id_abi_cxx11_(&local_260,pOVar5);
        DBChange::DBChange(&local_198,&local_26c,&local_260,(string *)(p_Var6 + 1));
        std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                  (&pTVar2->changes_,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.parameter._M_dataplus._M_p != &local_198.parameter.field_2) {
          operator_delete(local_198.parameter._M_dataplus._M_p,
                          local_198.parameter.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.obj_name._M_dataplus._M_p != &local_198.obj_name.field_2) {
          operator_delete(local_198.obj_name._M_dataplus._M_p,
                          local_198.obj_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        pTVar2 = local_268;
        pcVar4 = local_210;
      }
      local_210 = pcVar4 + 8;
    } while (local_210 != local_218);
  }
  local_210 = pcVar4;
  if (local_238._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_238._M_dataplus._M_p,
                    local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p);
  }
  pTVar2 = local_268;
  local_26c = Drop;
  OnDiskDataset::get_id_abi_cxx11_(&local_260,local_240);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  DBChange::DBChange(&local_150,&local_26c,&local_260,&local_238);
  std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
            (&pTVar2->changes_,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.parameter._M_dataplus._M_p != &local_150.parameter.field_2) {
    operator_delete(local_150.parameter._M_dataplus._M_p,
                    local_150.parameter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.obj_name._M_dataplus._M_p != &local_150.obj_name.field_2) {
    operator_delete(local_150.obj_name._M_dataplus._M_p,
                    local_150.obj_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  LOCK();
  paVar1 = &local_268->spec_->work_done_;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  Indexer::~Indexer(&local_108);
  return;
}

Assistant:

void DatabaseSnapshot::reindex_dataset(Task *task,
                                       const std::vector<IndexType> &types,
                                       const std::string &dataset_name) const {
    const OnDiskDataset *source = find_dataset(dataset_name);

    if (source == nullptr) {
        throw std::runtime_error("source dataset was not found");
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(source->get_file_count() + 1);

    source->for_each_filename([&indexer, &task](const std::string &target) {
        spdlog::debug("Reindexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    });

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : source->get_taints()) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->change(DBChange(DbChangeType::Drop, source->get_id()));
    task->spec().add_progress(1);
}